

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void SetWindowViewport(ImGuiWindow_conflict *window,ImGuiViewportP_conflict1 *viewport)

{
  ImGuiViewportP_conflict1 *pIVar1;
  
  if ((window->ViewportOwned == true) && (pIVar1 = window->Viewport, pIVar1->Window == window)) {
    (pIVar1->super_ImGuiViewport).Size.x = 0.0;
    (pIVar1->super_ImGuiViewport).Size.y = 0.0;
  }
  window->Viewport = viewport;
  window->ViewportId = (viewport->super_ImGuiViewport).ID;
  window->ViewportOwned = viewport->Window == window;
  return;
}

Assistant:

static void SetWindowViewport(ImGuiWindow* window, ImGuiViewportP* viewport)
{
    // Abandon viewport
    if (window->ViewportOwned && window->Viewport->Window == window)
        window->Viewport->Size = ImVec2(0.0f, 0.0f);

    window->Viewport = viewport;
    window->ViewportId = viewport->ID;
    window->ViewportOwned = (viewport->Window == window);
}